

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeArrayPrototype
               (DynamicObject *arrayPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  Type *addr;
  Type *addr_00;
  JavascriptLibrary *this;
  RecyclableObject *prototype;
  code *pcVar1;
  bool bVar2;
  RuntimeFunction *pRVar3;
  undefined4 *puVar4;
  JavascriptFunction *pJVar5;
  DynamicTypeHandler *typeHandler_00;
  DynamicType *type;
  DynamicObject *pDVar6;
  Var pvVar7;
  ScriptContext *pSVar8;
  
  DeferredTypeHandlerBase::Convert(typeHandler,arrayPrototype,mode,0x1b,0);
  this = (((arrayPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar8 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (arrayPrototype,0x67,(this->super_JavascriptLibraryBase).arrayConstructor.ptr,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptArray::EntryInfo::At,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x51);
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x51,pRVar3,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x7d0);
  *(RuntimeFunction **)&this->field_0x7d0 = pRVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x7d0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptArray::EntryInfo::Push,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x127);
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x127,pRVar3,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x798);
  *(RuntimeFunction **)&this->field_0x798 = pRVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x798);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptArray::EntryInfo::Concat,1,(DynamicObject *)0x0
                      ,(DynamicType *)0x0,0x65);
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x65,pRVar3,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x7d8);
  *(RuntimeFunction **)&this->field_0x7d8 = pRVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x7d8);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptArray::EntryInfo::Join,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0xcc);
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0xcc,pRVar3,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x7f8);
  *(RuntimeFunction **)&this->field_0x7f8 = pRVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x7f8);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptArray::EntryInfo::Pop,0,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x120);
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x120,pRVar3,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x7a0);
  *(RuntimeFunction **)&this->field_0x7a0 = pRVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x7a0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptArray::EntryInfo::Reverse,0,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x136);
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x136,pRVar3,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x808);
  *(RuntimeFunction **)&this->field_0x808 = pRVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x808);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptArray::EntryInfo::Shift,0,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x14e);
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x14e,pRVar3,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x810);
  *(RuntimeFunction **)&this->field_0x810 = pRVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x810);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptArray::EntryInfo::Slice,2,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x150);
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x150,pRVar3,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x818);
  *(RuntimeFunction **)&this->field_0x818 = pRVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x818);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptArray::EntryInfo::Splice,2,(DynamicObject *)0x0
                      ,(DynamicType *)0x0,0x155);
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x155,pRVar3,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x820);
  *(RuntimeFunction **)&this->field_0x820 = pRVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x820);
  addr = &this->arrayPrototypeToStringFunction;
  addr_00 = &this->arrayPrototypeToLocaleStringFunction;
  pJVar5 = (this->arrayPrototypeToLocaleStringFunction).ptr;
  if ((this->arrayPrototypeToStringFunction).ptr == (JavascriptFunction *)0x0) {
    if (pJVar5 != (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x80e,
                                  "(library->arrayPrototypeToLocaleStringFunction == nullptr)",
                                  "library->arrayPrototypeToLocaleStringFunction == nullptr");
      if (!bVar2) goto LAB_00bea551;
      *puVar4 = 0;
    }
    pRVar3 = DefaultCreateFunction
                       (this,(FunctionInfo *)JavascriptArray::EntryInfo::ToLocaleString,0,
                        (DynamicObject *)0x0,(DynamicType *)0x0,0x172);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x172,pRVar3,6,0,0,0);
    Memory::Recycler::WBSetBit((char *)addr_00);
    (this->arrayPrototypeToLocaleStringFunction).ptr = &pRVar3->super_JavascriptFunction;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
    pRVar3 = DefaultCreateFunction
                       (this,(FunctionInfo *)JavascriptArray::EntryInfo::ToString,0,
                        (DynamicObject *)0x0,(DynamicType *)0x0,0x178);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x178,pRVar3,6,0,0,0);
    Memory::Recycler::WBSetBit((char *)addr);
    (this->arrayPrototypeToStringFunction).ptr = &pRVar3->super_JavascriptFunction;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
  }
  else {
    if (pJVar5 == (JavascriptFunction *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                  ,0x815,"(library->arrayPrototypeToLocaleStringFunction)",
                                  "library->arrayPrototypeToLocaleStringFunction");
      if (!bVar2) {
LAB_00bea551:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x172,addr_00->ptr,6,0,0,0);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x178,addr->ptr,6,0,0,0);
  }
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptArray::EntryInfo::Unshift,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x18a);
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x18a,pRVar3,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x828);
  *(RuntimeFunction **)&this->field_0x828 = pRVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x828);
  bVar2 = ScriptContext::IsJsBuiltInEnabled(pSVar8);
  if (!bVar2) {
    pRVar3 = DefaultCreateFunction
                       (this,(FunctionInfo *)JavascriptArray::EntryInfo::IndexOf,1,
                        (DynamicObject *)0x0,(DynamicType *)0x0,0xb9);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0xb9,pRVar3,6,0,0,0);
    Memory::Recycler::WBSetBit(&this->field_0x7e0);
    *(RuntimeFunction **)&this->field_0x7e0 = pRVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x7e0);
    pRVar3 = DefaultCreateFunction
                       (this,(FunctionInfo *)JavascriptArray::EntryInfo::Includes,1,
                        (DynamicObject *)0x0,(DynamicType *)0x0,0xb8);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0xb8,pRVar3,6,0,0,0);
    Memory::Recycler::WBSetBit(&this->field_0x7e8);
    *(RuntimeFunction **)&this->field_0x7e8 = pRVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x7e8);
  }
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptArray::EntryInfo::Sort,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x152);
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x152,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptArray::EntryInfo::LastIndexOf,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0xd0);
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0xd0,pRVar3,6,0,0,0);
  Memory::Recycler::WBSetBit(&this->field_0x800);
  *(RuntimeFunction **)&this->field_0x800 = pRVar3;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->field_0x800);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptArray::EntryInfo::Map,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0xd5);
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0xd5,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptArray::EntryInfo::ReduceRight,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x12d);
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x12d,pRVar3);
  if (((pSVar8->config).threadConfig)->m_ES6String == true) {
    pRVar3 = DefaultCreateFunction
                       (this,(FunctionInfo *)JavascriptArray::EntryInfo::Find,1,(DynamicObject *)0x0
                        ,(DynamicType *)0x0,0x8b);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x8b,pRVar3,6,0,0,0);
    pRVar3 = DefaultCreateFunction
                       (this,(FunctionInfo *)JavascriptArray::EntryInfo::FindIndex,1,
                        (DynamicObject *)0x0,(DynamicType *)0x0,0x8c);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x8c,pRVar3);
  }
  if (((pSVar8->config).threadConfig)->m_ESArrayFindFromLast == true) {
    pRVar3 = DefaultCreateFunction
                       (this,(FunctionInfo *)JavascriptArray::EntryInfo::FindLast,1,
                        (DynamicObject *)0x0,(DynamicType *)0x0,0x8d);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x8d,pRVar3,6,0,0,0);
    pRVar3 = DefaultCreateFunction
                       (this,(FunctionInfo *)JavascriptArray::EntryInfo::FindLastIndex,1,
                        (DynamicObject *)0x0,(DynamicType *)0x0,0x8e);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x8e,pRVar3);
  }
  bVar2 = ScriptContext::IsJsBuiltInEnabled(pSVar8);
  if (bVar2) {
    EnsureBuiltInEngineIsReady(Array_prototype,pSVar8);
  }
  else {
    pJVar5 = EnsureArrayPrototypeEntriesFunction(this);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x7a,pJVar5,6,0,0,0);
    pJVar5 = EnsureArrayPrototypeKeysFunction(this);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0xcf,pJVar5,6,0,0,0);
    pJVar5 = EnsureArrayPrototypeValuesFunction(this);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,399,pJVar5,6,0,0,0);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x14,pJVar5,6,0,0,0);
    pRVar3 = DefaultCreateFunction
                       (this,(FunctionInfo *)JavascriptArray::EntryInfo::Filter,1,
                        (DynamicObject *)0x0,(DynamicType *)0x0,0x89);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x89,pRVar3,6,0,0,0);
    pJVar5 = EnsureArrayPrototypeForEachFunction(this);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x93,pJVar5,6,0,0,0);
    pRVar3 = DefaultCreateFunction
                       (this,(FunctionInfo *)JavascriptArray::EntryInfo::Some,1,(DynamicObject *)0x0
                        ,(DynamicType *)0x0,0x151);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x151,pRVar3,6,0,0,0);
    pRVar3 = DefaultCreateFunction
                       (this,(FunctionInfo *)JavascriptArray::EntryInfo::Reduce,1,
                        (DynamicObject *)0x0,(DynamicType *)0x0,300);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,300,pRVar3,6,0,0,0);
    pRVar3 = DefaultCreateFunction
                       (this,(FunctionInfo *)JavascriptArray::EntryInfo::Every,1,
                        (DynamicObject *)0x0,(DynamicType *)0x0,0x82);
    (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x82,pRVar3,6,0,0,0);
  }
  prototype = (this->super_JavascriptLibraryBase).nullValue.ptr;
  typeHandler_00 = (DynamicTypeHandler *)NullTypeHandler<false>::GetDefaultInstance();
  type = DynamicType::New(pSVar8,TypeIds_Object,prototype,(JavascriptMethod)0x0,typeHandler_00,false
                          ,false);
  pDVar6 = DynamicObject::New(this->recycler,type);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0x51,pvVar7,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,99,pvVar7,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0x7a,pvVar7,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0x88,pvVar7,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0x8b,pvVar7,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0x8c,pvVar7,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0x86,pvVar7,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0x87,pvVar7,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0xb8,pvVar7,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0xcf,pvVar7,0);
  pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
  (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x17])(pDVar6,399,pvVar7,0);
  if (((pSVar8->config).threadConfig)->m_ESArrayFindFromLast == true) {
    pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
    (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0x8d,pvVar7,0);
    pvVar7 = JavascriptBoolean::ToVar(1,pSVar8);
    (*(pDVar6->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x17])(pDVar6,0x8e,pvVar7,0);
  }
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x1c,pDVar6,2,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptArray::EntryInfo::Fill,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x88);
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,0x88,pRVar3,6,0,0,0);
  pRVar3 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptArray::EntryInfo::CopyWithin,2,
                      (DynamicObject *)0x0,(DynamicType *)0x0,99);
  pSVar8 = (ScriptContext *)0x63;
  (*(arrayPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(arrayPrototype,99,pRVar3,6,0,0,0);
  CheckRegisteredBuiltIns((Type *)&this->field_0x650,pSVar8);
  DynamicObject::SetHasNoEnumerableProperties(arrayPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeArrayPrototype(DynamicObject* arrayPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(arrayPrototype, mode, 27);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterArray
        // so that the update is in sync with profiler

        ScriptContext* scriptContext = arrayPrototype->GetScriptContext();
        JavascriptLibrary* library = arrayPrototype->GetLibrary();

        library->AddMember(arrayPrototype, PropertyIds::constructor, library->arrayConstructor);

        Field(JavascriptFunction*)* builtinFuncs = library->GetBuiltinFunctions();

        builtinFuncs[BuiltinFunction::JavascriptArray_At]                 = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::at,              &JavascriptArray::EntryInfo::At,                1);
        builtinFuncs[BuiltinFunction::JavascriptArray_Push]               = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::push,            &JavascriptArray::EntryInfo::Push,              1);
        builtinFuncs[BuiltinFunction::JavascriptArray_Concat]             = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::concat,          &JavascriptArray::EntryInfo::Concat,            1);
        builtinFuncs[BuiltinFunction::JavascriptArray_Join]               = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::join,            &JavascriptArray::EntryInfo::Join,              1);
        builtinFuncs[BuiltinFunction::JavascriptArray_Pop]                = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::pop,             &JavascriptArray::EntryInfo::Pop,               0);
        builtinFuncs[BuiltinFunction::JavascriptArray_Reverse]            = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::reverse,         &JavascriptArray::EntryInfo::Reverse,           0);
        builtinFuncs[BuiltinFunction::JavascriptArray_Shift]              = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::shift,           &JavascriptArray::EntryInfo::Shift,             0);
        builtinFuncs[BuiltinFunction::JavascriptArray_Slice]              = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::slice,           &JavascriptArray::EntryInfo::Slice,             2);
        builtinFuncs[BuiltinFunction::JavascriptArray_Splice]             = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::splice,          &JavascriptArray::EntryInfo::Splice,            2);

        // The toString and toLocaleString properties are shared between Array.prototype and %TypedArray%.prototype.
        // Whichever prototype is initialized first will create the functions, the other should just load the existing function objects.
        if (library->arrayPrototypeToStringFunction == nullptr)
        {
            Assert(library->arrayPrototypeToLocaleStringFunction == nullptr);

            library->arrayPrototypeToLocaleStringFunction = /* No inlining       Array_ToLocaleString */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::toLocaleString, &JavascriptArray::EntryInfo::ToLocaleString, 0);
            library->arrayPrototypeToStringFunction =       /* No inlining       Array_ToString       */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::toString, &JavascriptArray::EntryInfo::ToString, 0);
        }
        else
        {
            Assert(library->arrayPrototypeToLocaleStringFunction);

            library->AddMember(arrayPrototype, PropertyIds::toLocaleString, library->arrayPrototypeToLocaleStringFunction);
            library->AddMember(arrayPrototype, PropertyIds::toString, library->arrayPrototypeToStringFunction);
        }

        builtinFuncs[BuiltinFunction::JavascriptArray_Unshift]            = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::unshift,         &JavascriptArray::EntryInfo::Unshift,           1);

        if (!scriptContext->IsJsBuiltInEnabled())
        {
            builtinFuncs[BuiltinFunction::JavascriptArray_IndexOf] = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::indexOf, &JavascriptArray::EntryInfo::IndexOf, 1);
            builtinFuncs[BuiltinFunction::JavascriptArray_Includes] = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::includes, &JavascriptArray::EntryInfo::Includes, 1);
        }

        /* No inlining                Array_Sort               */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::sort, &JavascriptArray::EntryInfo::Sort, 1);

        builtinFuncs[BuiltinFunction::JavascriptArray_LastIndexOf]    = library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::lastIndexOf,     &JavascriptArray::EntryInfo::LastIndexOf,       1);
        /* No inlining                Array_Map            */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::map,             &JavascriptArray::EntryInfo::Map,               1);
        /* No inlining                Array_ReduceRight    */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::reduceRight,     &JavascriptArray::EntryInfo::ReduceRight,       1);

        if (scriptContext->GetConfig()->IsES6StringExtensionsEnabled()) // This is not a typo, Array.prototype.find and .findIndex are part of the ES6 Improved String APIs feature
        {
            /* No inlining            Array_Find           */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::find,            &JavascriptArray::EntryInfo::Find,              1);
            /* No inlining            Array_FindIndex      */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::findIndex,       &JavascriptArray::EntryInfo::FindIndex,         1);
        }
        if (scriptContext->GetConfig()->IsESArrayFindFromLastEnabled())
        {
            /* No inlining            Array_FindLast           */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::findLast, &JavascriptArray::EntryInfo::FindLast, 1);
            /* No inlining            Array_FindLastIndex      */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::findLastIndex, &JavascriptArray::EntryInfo::FindLastIndex, 1);
        }

#ifdef ENABLE_JS_BUILTINS
        if (scriptContext->IsJsBuiltInEnabled())
        {
            EnsureBuiltInEngineIsReady(JsBuiltInFile::Array_prototype, scriptContext);
        }
        else
#endif
        {
            /* No inlining                Array_Entries        */
            library->AddMember(arrayPrototype, PropertyIds::entries, library->EnsureArrayPrototypeEntriesFunction());

            /* No inlining                Array_Keys           */
            library->AddMember(arrayPrototype, PropertyIds::keys, library->EnsureArrayPrototypeKeysFunction());

            JavascriptFunction *values = library->EnsureArrayPrototypeValuesFunction();
            /* No inlining                Array_Values         */ library->AddMember(arrayPrototype, PropertyIds::values, values);
            /* No inlining                Array_SymbolIterator */ library->AddMember(arrayPrototype, PropertyIds::_symbolIterator, values);

            /* No inlining                Array_Filter         */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::filter, &JavascriptArray::EntryInfo::Filter, 1);
            /* No inlining                Array_ForEach        */ library->AddMember(arrayPrototype, PropertyIds::forEach, library->EnsureArrayPrototypeForEachFunction());
            /* No inlining                Array_Some           */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::some, &JavascriptArray::EntryInfo::Some, 1);
            /* No inlining                Array_Reduce         */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::reduce, &JavascriptArray::EntryInfo::Reduce, 1);
            /* No inlining                Array_Every          */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::every, &JavascriptArray::EntryInfo::Every, 1);
        }

        DynamicType* dynamicType = DynamicType::New(scriptContext, TypeIds_Object, library->nullValue, nullptr, NullTypeHandler<false>::GetDefaultInstance(), false);
        DynamicObject* unscopablesList = DynamicObject::New(library->GetRecycler(), dynamicType);
        unscopablesList->SetProperty(PropertyIds::at,               JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::copyWithin,       JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::entries,          JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::fill,             JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::find,             JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::findIndex,        JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::flat,             JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::flatMap,          JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::includes,         JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::keys,             JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        unscopablesList->SetProperty(PropertyIds::values,           JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);

        if (scriptContext->GetConfig()->IsESArrayFindFromLastEnabled())
        {
            unscopablesList->SetProperty(PropertyIds::findLast, JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
            unscopablesList->SetProperty(PropertyIds::findLastIndex, JavascriptBoolean::ToVar(true, scriptContext), PropertyOperation_None, nullptr);
        }

        library->AddMember(arrayPrototype, PropertyIds::_symbolUnscopables, unscopablesList, PropertyConfigurable);

        /* No inlining            Array_Fill           */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::fill, &JavascriptArray::EntryInfo::Fill, 1);
        /* No inlining            Array_CopyWithin     */ library->AddFunctionToLibraryObject(arrayPrototype, PropertyIds::copyWithin, &JavascriptArray::EntryInfo::CopyWithin, 2);
        DebugOnly(CheckRegisteredBuiltIns(builtinFuncs, scriptContext));

        arrayPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }